

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O2

void __thiscall FTextureManager::AddGroup(FTextureManager *this,int wadnum,int ns,int usetype)

{
  int lump;
  int iVar1;
  int iVar2;
  uint uVar3;
  FString Name;
  
  lump = FWadCollection::GetFirstLump(&Wads,wadnum);
  iVar1 = FWadCollection::GetLastLump(&Wads,wadnum);
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  Name.Chars = FString::NullString.Nothing;
  do {
    if (iVar1 < lump) {
      FString::~FString(&Name);
      return;
    }
    iVar2 = FWadCollection::GetLumpNamespace(&Wads,lump);
    if (iVar2 == ns) {
      FWadCollection::GetLumpName(&Wads,&Name,lump);
      iVar2 = FWadCollection::CheckNumForName(&Wads,Name.Chars,ns);
      if (lump == iVar2) {
LAB_005a8d7f:
        CreateTexture(this,lump,usetype);
      }
LAB_005a8d8e:
      (*StartScreen->_vptr_FStartupScreen[2])();
    }
    else if ((ns == 2) && (uVar3 = FWadCollection::GetLumpFlags(&Wads,lump), (uVar3 & 1) != 0)) {
      iVar2 = FWadCollection::CheckNumForName(&Wads,Name.Chars,2);
      if (iVar2 < lump) goto LAB_005a8d7f;
      goto LAB_005a8d8e;
    }
    lump = lump + 1;
  } while( true );
}

Assistant:

void FTextureManager::AddGroup(int wadnum, int ns, int usetype)
{
	int firsttx = Wads.GetFirstLump(wadnum);
	int lasttx = Wads.GetLastLump(wadnum);
	FString Name;

	// Go from first to last so that ANIMDEFS work as expected. However,
	// to avoid duplicates (and to keep earlier entries from overriding
	// later ones), the texture is only inserted if it is the one returned
	// by doing a check by name in the list of wads.

	for (; firsttx <= lasttx; ++firsttx)
	{
		if (Wads.GetLumpNamespace(firsttx) == ns)
		{
			Wads.GetLumpName (Name, firsttx);

			if (Wads.CheckNumForName (Name, ns) == firsttx)
			{
				CreateTexture (firsttx, usetype);
			}
			StartScreen->Progress();
		}
		else if (ns == ns_flats && Wads.GetLumpFlags(firsttx) & LUMPF_MAYBEFLAT)
		{
			if (Wads.CheckNumForName (Name, ns) < firsttx)
			{
				CreateTexture (firsttx, usetype);
			}
			StartScreen->Progress();
		}
	}
}